

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O0

string * generate_cert(string *__return_storage_ptr__,string *domain_name,string *main_dirpath)

{
  bool bVar1;
  directory_entry *this;
  path *__p;
  char *__command;
  char cVar2;
  __type_conflict local_5d2;
  allocator<char> local_5a1;
  string local_5a0;
  int local_57c;
  undefined1 local_578 [4];
  int _;
  string command;
  ostream local_538 [8];
  ofstream file;
  path local_338;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  path local_2a8;
  allocator<char> local_279;
  string local_278;
  undefined1 local_258 [8];
  string ext_filepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  path local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  byte local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined8 local_180;
  size_t pos;
  string path_string;
  path path;
  directory_entry *p;
  directory_iterator local_120;
  undefined1 local_110 [8];
  directory_iterator __end1;
  undefined1 local_f0 [8];
  directory_iterator __begin1;
  directory_iterator local_b8;
  directory_iterator *local_a8;
  directory_iterator *__range1;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string crt_dirpath;
  lock_guard<std::mutex> m;
  string *main_dirpath_local;
  string *domain_name_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&crt_dirpath.field_2 + 8),&mut);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"/",&local_89);
  std::operator+(&local_68,main_dirpath,&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"certs");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&__begin1._M_dir._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_b8,(path *)&__begin1._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dir._M_refcount);
  local_a8 = &local_b8;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_a8);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_f0,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_120,local_a8);
  std::filesystem::__cxx11::end((directory_iterator *)local_110);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_120);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_f0,(directory_iterator *)local_110), bVar1)
  {
    this = (directory_entry *)
           std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_f0);
    __p = std::filesystem::__cxx11::directory_entry::path(this);
    std::filesystem::__cxx11::path::path((path *)((long)&path_string.field_2 + 8),__p);
    std::filesystem::__cxx11::path::string((string *)&pos,(path *)((long)&path_string.field_2 + 8));
    local_180 = std::__cxx11::string::rfind((char *)&pos,0x1bc79d);
    local_1a1 = 0;
    bVar1 = std::filesystem::is_directory((path *)((long)&path_string.field_2 + 8));
    local_5d2 = false;
    if (bVar1) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&pos);
      local_1a1 = 1;
      local_5d2 = std::operator==(&local_1a0,domain_name);
    }
    if ((local_1a1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    cVar2 = local_5d2 != false;
    if ((bool)cVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"localhost.crt",&local_1c9);
      build_path(__return_storage_ptr__,(string *)local_48,domain_name,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
    }
    std::__cxx11::string::~string((string *)&pos);
    std::filesystem::__cxx11::path::~path((path *)((long)&path_string.field_2 + 8));
    if ((bool)cVar2) goto LAB_001116df;
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_f0);
  }
  cVar2 = '\x02';
LAB_001116df:
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_110)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_f0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_b8);
  if (cVar2 == '\x02') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ext_filepath.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,"/"
                  );
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&ext_filepath.field_2 + 8),domain_name);
    std::filesystem::__cxx11::path::path(&local_1f8,&local_218,auto_format);
    std::filesystem::create_directories(&local_1f8);
    std::filesystem::__cxx11::path::~path(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)(ext_filepath.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"domains.ext",&local_279);
    build_path((string *)local_258,(string *)local_48,domain_name,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"/",&local_309);
    std::operator+(&local_2e8,main_dirpath,&local_308);
    std::operator+(&local_2c8,&local_2e8,"domains.ext");
    std::filesystem::__cxx11::path::path(&local_2a8,&local_2c8,auto_format);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
               auto_format);
    std::filesystem::copy((EVP_PKEY_CTX *)&local_2a8,(EVP_PKEY_CTX *)&local_338);
    std::filesystem::__cxx11::path::~path(&local_338);
    std::filesystem::__cxx11::path::~path(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    std::ofstream::ofstream(local_538,(string *)local_258,_S_app);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"DNS.1 = ",domain_name);
    std::operator<<(local_538,(string *)(command.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
    std::ofstream::~ofstream(local_538);
    build_path_command((string *)local_578,(string *)local_48,domain_name,main_dirpath);
    __command = (char *)std::__cxx11::string::c_str();
    local_57c = system(__command);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"localhost.crt",&local_5a1);
    build_path(__return_storage_ptr__,(string *)local_48,domain_name,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::string::~string((string *)local_258);
  }
  std::__cxx11::string::~string((string *)local_48);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)((long)&crt_dirpath.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string generate_cert(const std::string& domain_name,
                            const std::string& main_dirpath) {
    std::lock_guard<std::mutex> m(mut);

    const std::string crt_dirpath = main_dirpath + std::string("/") + CERTS_DIRNAME;

    for(const auto& p : fs::directory_iterator(crt_dirpath)) {
        fs::path path = p.path();
        std::string path_string = path.string();
        size_t pos = path_string.rfind("/");
        if (fs::is_directory(path) && 
                path_string.substr(pos + 1, path_string.length()) == domain_name) {
            return build_path(crt_dirpath, domain_name, CRT_FILENAME);
        }
    }

    fs::create_directories(crt_dirpath + "/" + domain_name);

    std::string ext_filepath = build_path(crt_dirpath, domain_name, EXT_FILENAME);

    fs::copy(main_dirpath + std::string("/") + EXT_FILENAME, ext_filepath); {
        std::ofstream file(ext_filepath, std::ios::app);
        file << "DNS.1 = " + domain_name;
    }
    std::string command = build_path_command(crt_dirpath, domain_name, main_dirpath);

    int _ = std::system(command.c_str());

    return build_path(crt_dirpath, domain_name, CRT_FILENAME);
}